

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::UninterpretedOption::IsInitialized(UninterpretedOption *this)

{
  int iVar1;
  Type *pTVar2;
  int iVar3;
  
  iVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  do {
    iVar3 = iVar1;
    if (iVar3 < 1) break;
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                       (&(this->name_).super_RepeatedPtrFieldBase,iVar3 + -1);
    iVar1 = iVar3 + -1;
  } while ((~(pTVar2->_has_bits_).has_bits_[0] & 3) == 0);
  return iVar3 < 1;
}

Assistant:

bool UninterpretedOption::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->name())) return false;
  return true;
}